

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_RemoveTarget
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DObject *this;
  PClassActor *filter_00;
  VMValue *pVVar1;
  AActor *removetarget;
  bool bVar2;
  bool local_53;
  FName local_50;
  FName local_4c;
  PClassActor *pPStack_48;
  FName species;
  MetaClass *filter;
  int flags;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1846,
                  "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    this = (DObject *)(param->field_0).field_1.a;
    local_53 = true;
    if (this != (DObject *)0x0) {
      local_53 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    }
    if (local_53 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1846,
                    "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 2) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1847,
                      "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
      filter._4_4_ = (pVVar1->field_0).i;
    }
    else {
      if (param[1].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1847,
                      "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      filter._4_4_ = param[1].field_0.i;
    }
    if (numparam < 3) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      bVar2 = false;
      if ((pVVar1->field_0).field_3.Type == '\x03') {
        pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
        bVar2 = true;
        if ((pVVar1->field_0).field_1.atag != 1) {
          pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
          bVar2 = (pVVar1->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar2) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1848,
                      "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      pPStack_48 = (PClassActor *)(pVVar1->field_0).field_1.a;
    }
    else {
      bVar2 = false;
      if ((param[2].field_0.field_3.Type == '\x03') &&
         (bVar2 = true, param[2].field_0.field_1.atag != 1)) {
        bVar2 = param[2].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar2) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1848,
                      "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pPStack_48 = (PClassActor *)param[2].field_0.field_1.a;
    }
    FName::FName(&local_4c);
    if (numparam < 4) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1849,
                      "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      FName::operator=(&local_4c,(pVVar1->field_0).i);
    }
    else {
      if (param[3].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1849,
                      "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      FName::operator=(&local_4c,param[3].field_0.i);
    }
    bVar2 = TObjPtr<AActor>::operator!=((TObjPtr<AActor> *)(this + 0xd),(AActor *)0x0);
    if (bVar2) {
      removetarget = TObjPtr::operator_cast_to_AActor_((TObjPtr *)(this + 0xd));
      filter_00 = pPStack_48;
      FName::FName(&local_50,&local_4c);
      DoRemove(removetarget,filter._4_4_,filter_00,&local_50);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1846,
                "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveTarget)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	if (self->target != NULL)
	{
		DoRemove(self->target, flags, filter, species);
	}
	return 0;
}